

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

int64_t __thiscall soul::Value::PackedData::getAsInt64(PackedData *this)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  double dVar4;
  bool local_19;
  PackedData *this_local;
  
  bVar1 = Type::isPrimitive(this->type);
  local_19 = true;
  if (!bVar1) {
    bVar1 = Type::isBoundedInt(this->type);
    local_19 = true;
    if (!bVar1) {
      local_19 = Type::isVectorOfSize1(this->type);
    }
  }
  checkAssertion(local_19,"type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1()",
                 "getAsInt64",0xb4);
  bVar1 = Type::isInteger32(this->type);
  if (bVar1) {
    iVar3 = getAs<int>(this);
    this_local = (PackedData *)(long)iVar3;
  }
  else {
    bVar1 = Type::isInteger64(this->type);
    if (bVar1) {
      this_local = (PackedData *)getAs<long>(this);
    }
    else {
      bVar1 = Type::isBool(this->type);
      if (bVar1) {
        uVar2 = getAs<unsigned_char>(this);
        this_local = (PackedData *)(long)(int)(uint)(uVar2 != '\0');
      }
      else {
        bVar1 = Type::isFloatingPoint(this->type);
        if (!bVar1) {
          throwInternalCompilerError("getAsInt64",0xbb);
        }
        dVar4 = getAsDouble(this);
        this_local = (PackedData *)(long)dVar4;
      }
    }
  }
  return (int64_t)this_local;
}

Assistant:

int64_t getAsInt64() const
    {
        SOUL_ASSERT (type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1());

        if (type.isInteger32())      return getAs<int32_t>();
        if (type.isInteger64())      return getAs<int64_t>();
        if (type.isBool())           return getAs<uint8_t>() != 0 ? 1 : 0;
        if (type.isFloatingPoint())  return static_cast<int64_t> (getAsDouble());

        SOUL_ASSERT_FALSE;
        return {};
    }